

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFileEqnStorage.cpp
# Opt level: O1

void __thiscall
TPZFileEqnStorage<std::complex<float>_>::Backward
          (TPZFileEqnStorage<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *f,
          DecomposeType dec)

{
  bool bVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  int64_t position;
  TPZEqnArray<std::complex<float>_> REqnArray;
  long local_32c8;
  TPZEqnArray<std::complex<float>_> local_32c0;
  
  TPZEqnArray<std::complex<float>_>::TPZEqnArray(&local_32c0);
  uVar2 = (int)(this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fNElements - 1;
  if (-1 < (int)uVar2) {
    lVar3 = (ulong)uVar2 + 1;
    do {
      lVar4 = (this->fBlockPos).super_TPZManVector<long,_10>.super_TPZVec<long>.fStore[lVar3 + -1];
      if (lVar4 != 0) {
        fseek((FILE *)this->fIOStream,lVar4,0);
        fread(&local_32c8,8,1,(FILE *)this->fIOStream);
        fseek((FILE *)this->fIOStream,local_32c8,0);
        TPZEqnArray<std::complex<float>_>::Read(&local_32c0,this->fIOStream);
        TPZEqnArray<std::complex<float>_>::EqnBackward(&local_32c0,f,dec);
      }
      lVar4 = lVar3 + -1;
      bVar1 = 0 < lVar3;
      lVar3 = lVar4;
    } while (lVar4 != 0 && bVar1);
  }
  TPZEqnArray<std::complex<float>_>::~TPZEqnArray(&local_32c0);
  return;
}

Assistant:

void TPZFileEqnStorage<TVar>::Backward(TPZFMatrix<TVar> &f, DecomposeType dec) const
{
	TPZEqnArray<TVar> REqnArray;
	int i;
	int64_t sizereturn;
	sizereturn = 0;
	for(i=fBlockPos.NElements()-1;i>=0;i--){
		if (fBlockPos[i]) {
			fseek(fIOStream,fBlockPos[i],SEEK_SET);
			int64_t position;
			sizereturn = fread(&position,sizeof(int64_t),1,fIOStream);
#ifdef PZDEBUG
			if (sizereturn != 1) DebugStop();
#endif
			fseek(fIOStream,position,SEEK_SET);
			REqnArray.Read(fIOStream);
			REqnArray.EqnBackward(f,dec); 
		}
	}
}